

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NRooks.cpp
# Opt level: O3

void __thiscall pm::NRooks::generateSamples(NRooks *this)

{
  Random *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  float fVar5;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  value_type local_70;
  float local_68;
  float fStack_64;
  ulong local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  uVar3 = (this->super_Sampler).numSets_;
  if (uVar3 != 0) {
    this_00 = &(this->super_Sampler).rnd_;
    uVar1 = (this->super_Sampler).numSamples_;
    uVar2 = 0;
    do {
      bVar4 = uVar1 != 0;
      uVar1 = 0;
      if (bVar4) {
        uVar3 = 0;
        do {
          local_48._0_16_ = ZEXT416((uint)(float)uVar3);
          local_68 = Random::real(this_00);
          local_58._0_4_ = (this->super_Sampler).numSamples_;
          local_58._4_4_ = (this->super_Sampler).numSets_;
          uStack_50 = *(undefined8 *)&(this->super_Sampler).field_0x14;
          fStack_64 = extraout_XMM0_Db;
          fVar5 = Random::real(this_00);
          auVar6._4_4_ = (float)local_48._0_4_ + fVar5;
          auVar6._0_4_ = (float)local_48._0_4_ + local_68;
          auVar6._8_4_ = (float)local_48._4_4_ + fStack_64;
          auVar6._12_4_ = (float)local_48._4_4_ + extraout_XMM0_Db_00;
          auVar8._0_8_ = local_58 & 0xffffffff;
          auVar8._8_4_ = (this->super_Sampler).numSamples_;
          auVar8._12_4_ = 0;
          auVar7._4_4_ = (float)(SUB168(auVar8 | _DAT_00110560,8) - DAT_00110560._8_8_);
          auVar7._0_4_ = (float)(SUB168(auVar8 | _DAT_00110560,0) - (double)DAT_00110560);
          auVar7._8_8_ = 0;
          auVar7 = divps(auVar6,auVar7);
          local_70 = auVar7._0_8_;
          std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::push_back
                    (&(this->super_Sampler).samples_,&local_70);
          uVar3 = uVar3 + 1;
          uVar1 = (this->super_Sampler).numSamples_;
        } while (uVar3 < uVar1);
        uVar3 = (this->super_Sampler).numSets_;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar3);
  }
  shuffleXCoords(this);
  shuffleYCoords(this);
  return;
}

Assistant:

void NRooks::generateSamples()
{
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < numSamples_; i++)
		{
			const Vector2 sp((i + rnd_.real()) / numSamples_, (i + rnd_.real()) / numSamples_);
			samples_.push_back(sp);
		}

	shuffleXCoords();
	shuffleYCoords();
}